

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::sext(APInt *this,uint Width)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint64_t *__dest;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  APInt *this_00;
  APInt *__src;
  ulong __n;
  byte bVar6;
  APInt AVar7;
  
  this_00 = (APInt *)CONCAT44(in_register_00000034,Width);
  uVar1 = this_00->BitWidth;
  if (in_EDX <= uVar1) {
    __assert_fail("Width > BitWidth && \"Invalid APInt SignExtend request\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x349,"APInt llvm::APInt::sext(unsigned int) const");
  }
  if (in_EDX < 0x41) {
    if ((ulong)uVar1 == 0) {
      __assert_fail("B > 0 && \"Bit width can\'t be 0.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                    ,0x2f6,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
    }
    if (0x40 < uVar1) {
      __assert_fail("B <= 64 && \"Bit width out of range.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                    ,0x2f7,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
    }
    bVar6 = -(char)uVar1;
    APInt(this,in_EDX,(long)((this_00->U).VAL << (bVar6 & 0x3f)) >> (bVar6 & 0x3f),false);
    uVar4 = extraout_RDX;
  }
  else {
    __dest = (uint64_t *)operator_new__((ulong)((uint)((ulong)in_EDX + 0x3f >> 3) & 0xfffffff8));
    this->BitWidth = in_EDX;
    (this->U).pVal = __dest;
    __src = this_00;
    if (0x40 < uVar1) {
      __src = (APInt *)(this_00->U).pVal;
    }
    iVar2 = (int)((ulong)uVar1 + 0x3f >> 6);
    __n = (ulong)(uint)(iVar2 * 8);
    memcpy(__dest,__src,__n);
    uVar5 = iVar2 - 1;
    bVar6 = -(char)uVar1;
    __dest[uVar5] = (long)(__dest[uVar5] << (bVar6 & 0x3f)) >> (bVar6 & 0x3f);
    bVar3 = operator[](this_00,uVar1 - 1);
    memset((void *)((long)__dest + __n),-(uint)bVar3,
           (ulong)(uint)(((int)((ulong)this->BitWidth + 0x3f >> 6) -
                         (int)((ulong)this_00->BitWidth + 0x3f >> 6)) * 8));
    clearUnusedBits(this);
    uVar4 = extraout_RDX_00;
  }
  AVar7._8_8_ = uVar4;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt APInt::sext(unsigned Width) const {
  assert(Width > BitWidth && "Invalid APInt SignExtend request");

  if (Width <= APINT_BITS_PER_WORD)
    return APInt(Width, SignExtend64(U.VAL, BitWidth));

  APInt Result(getMemory(getNumWords(Width)), Width);

  // Copy words.
  std::memcpy(Result.U.pVal, getRawData(), getNumWords() * APINT_WORD_SIZE);

  // Sign extend the last word since there may be unused bits in the input.
  Result.U.pVal[getNumWords() - 1] =
      SignExtend64(Result.U.pVal[getNumWords() - 1],
                   ((BitWidth - 1) % APINT_BITS_PER_WORD) + 1);

  // Fill with sign bits.
  std::memset(Result.U.pVal + getNumWords(), isNegative() ? -1 : 0,
              (Result.getNumWords() - getNumWords()) * APINT_WORD_SIZE);
  Result.clearUnusedBits();
  return Result;
}